

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnElemSegmentElemExpr_RefFunc
          (BinaryReaderIR *this,Index segment_index,Index func_index)

{
  value_type pEVar1;
  size_type sVar2;
  reference ppEVar3;
  Var local_b8;
  undefined1 local_70 [8];
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_68;
  undefined1 local_60 [8];
  ExprList init_expr;
  Location loc;
  ElemSegment *segment;
  Index func_index_local;
  Index segment_index_local;
  BinaryReaderIR *this_local;
  
  sVar2 = std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>::size
                    (&this->module_->elem_segments);
  if ((ulong)segment_index == sVar2 - 1) {
    ppEVar3 = std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>::operator[]
                        (&this->module_->elem_segments,(ulong)segment_index);
    pEVar1 = *ppEVar3;
    GetLocation((Location *)&init_expr.size_,this);
    intrusive_list<wabt::Expr>::intrusive_list((intrusive_list<wabt::Expr> *)local_60);
    Var::Var(&local_b8,func_index,(Location *)&init_expr.size_);
    std::make_unique<wabt::VarExpr<(wabt::ExprType)36>,wabt::Var,wabt::Location&>
              ((Var *)local_70,&local_b8.loc);
    std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
    unique_ptr<wabt::VarExpr<(wabt::ExprType)36>,std::default_delete<wabt::VarExpr<(wabt::ExprType)36>>,void>
              ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_68,
               (unique_ptr<wabt::VarExpr<(wabt::ExprType)36>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)36>_>_>
                *)local_70);
    intrusive_list<wabt::Expr>::push_back((intrusive_list<wabt::Expr> *)local_60,&local_68);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_68);
    std::
    unique_ptr<wabt::VarExpr<(wabt::ExprType)36>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)36>_>_>
    ::~unique_ptr((unique_ptr<wabt::VarExpr<(wabt::ExprType)36>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)36>_>_>
                   *)local_70);
    Var::~Var(&local_b8);
    std::
    vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>::
    push_back(&pEVar1->elem_exprs,(value_type *)local_60);
    Result::Result((Result *)((long)&this_local + 4),Ok);
    intrusive_list<wabt::Expr>::~intrusive_list((intrusive_list<wabt::Expr> *)local_60);
    return (Result)this_local._4_4_;
  }
  __assert_fail("segment_index == module_->elem_segments.size() - 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/binary-reader-ir.cc"
                ,0x524,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnElemSegmentElemExpr_RefFunc(Index, Index)"
               );
}

Assistant:

Result BinaryReaderIR::OnElemSegmentElemExpr_RefFunc(Index segment_index,
                                                     Index func_index) {
  assert(segment_index == module_->elem_segments.size() - 1);
  ElemSegment* segment = module_->elem_segments[segment_index];
  Location loc = GetLocation();
  ExprList init_expr;
  init_expr.push_back(std::make_unique<RefFuncExpr>(Var(func_index, loc), loc));
  segment->elem_exprs.push_back(std::move(init_expr));
  return Result::Ok;
}